

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O0

double * MatInv(double *A,int row,int col)

{
  double dVar1;
  int local_38;
  int i;
  int len;
  double det;
  double *Out;
  int col_local;
  int row_local;
  double *A_local;
  
  malloc((long)row * 8 * (long)col);
  dVar1 = MatDet(A,row);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      A_local = MatAdj(A,row,col);
      for (local_38 = 0; local_38 < row * row; local_38 = local_38 + 1) {
        A_local[local_38] = A_local[local_38] / dVar1;
      }
    }
  }
  else {
    A_local = MatPInv(A,row,col);
  }
  return A_local;
}

Assistant:

double *MatInv(double *A, int row, int col) {
    double *Out = (double *) malloc(sizeof(double) * row * col);
    double det = MatDet(A, row); //求行列式
    if (det == 0) {
        return MatPInv(A,row,col);
    }
    if (det != 0) {
        Out = MatAdj(A, row, col); //求伴随矩阵
        int len = row * row;
        for (int i = 0; i < len; i++)
            *(Out + i) /= det;
        return Out;
    }
}